

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O0

GraphicsPipelineBuilder * __thiscall
vkt::synchronization::GraphicsPipelineBuilder::setShader
          (GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkShaderStageFlagBits stage,ProgramBinary *binary,VkSpecializationInfo *specInfo)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)14>_> data_03;
  Handle<(vk::HandleType)14> *pHVar1;
  undefined1 local_1c8 [8];
  VkPipelineShaderStageCreateInfo pipelineShaderStageInfo;
  RefData<vk::Handle<(vk::HandleType)14>_> local_178;
  Move<vk::Handle<(vk::HandleType)14>_> local_158;
  RefData<vk::Handle<(vk::HandleType)14>_> local_138;
  Move<vk::Handle<(vk::HandleType)14>_> local_118;
  RefData<vk::Handle<(vk::HandleType)14>_> local_f8;
  Move<vk::Handle<(vk::HandleType)14>_> local_d8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_b8;
  Move<vk::Handle<(vk::HandleType)14>_> local_88;
  RefData<vk::Handle<(vk::HandleType)14>_> local_68;
  Handle<(vk::HandleType)14> local_48;
  VkShaderModule module;
  VkSpecializationInfo *specInfo_local;
  ProgramBinary *binary_local;
  VkShaderStageFlagBits stage_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  GraphicsPipelineBuilder *this_local;
  
  module.m_internal = (deUint64)specInfo;
  ::vk::Handle<(vk::HandleType)14>::Handle(&local_48);
  switch(stage) {
  case VK_SHADER_STAGE_VERTEX_BIT:
    ::vk::createShaderModule(&local_88,vk,device,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_68,(Move *)&local_88);
    data.deleter.m_deviceIface = local_68.deleter.m_deviceIface;
    data.object.m_internal = local_68.object.m_internal;
    data.deleter.m_device = local_68.deleter.m_device;
    data.deleter.m_allocator = local_68.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (&this->m_vertexShaderModule,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_88);
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                       (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>
                       );
    local_48.m_internal = pHVar1->m_internal;
    break;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    ::vk::createShaderModule(&local_d8,vk,device,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_b8,(Move *)&local_d8);
    data_00.deleter.m_deviceIface = local_b8.deleter.m_deviceIface;
    data_00.object.m_internal = local_b8.object.m_internal;
    data_00.deleter.m_device = local_b8.deleter.m_device;
    data_00.deleter.m_allocator = local_b8.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (&this->m_tessControlShaderModule,data_00);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_d8);
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                       (&(this->m_tessControlShaderModule).
                         super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    local_48.m_internal = pHVar1->m_internal;
    break;
  default:
    return this;
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
    ::vk::createShaderModule(&local_118,vk,device,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_f8,(Move *)&local_118);
    data_01.deleter.m_deviceIface = local_f8.deleter.m_deviceIface;
    data_01.object.m_internal = local_f8.object.m_internal;
    data_01.deleter.m_device = local_f8.deleter.m_device;
    data_01.deleter.m_allocator = local_f8.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (&this->m_tessEvaluationShaderModule,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_118);
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                       (&(this->m_tessEvaluationShaderModule).
                         super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    local_48.m_internal = pHVar1->m_internal;
    break;
  case VK_SHADER_STAGE_GEOMETRY_BIT:
    ::vk::createShaderModule(&local_158,vk,device,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
    data_02.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
    data_02.object.m_internal = local_138.object.m_internal;
    data_02.deleter.m_device = local_138.deleter.m_device;
    data_02.deleter.m_allocator = local_138.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (&this->m_geometryShaderModule,data_02);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_158);
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                       (&(this->m_geometryShaderModule).
                         super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    local_48.m_internal = pHVar1->m_internal;
    break;
  case VK_SHADER_STAGE_FRAGMENT_BIT:
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineShaderStageInfo.pSpecializationInfo
               ,vk,device,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_178,(Move *)&pipelineShaderStageInfo.pSpecializationInfo);
    data_03.deleter.m_deviceIface = local_178.deleter.m_deviceIface;
    data_03.object.m_internal = local_178.object.m_internal;
    data_03.deleter.m_device = local_178.deleter.m_device;
    data_03.deleter.m_allocator = local_178.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (&this->m_fragmentShaderModule,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineShaderStageInfo.pSpecializationInfo
              );
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                       (&(this->m_fragmentShaderModule).
                         super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    local_48.m_internal = pHVar1->m_internal;
  }
  local_1c8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  pipelineShaderStageInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineShaderStageInfo._4_4_ = 0;
  pipelineShaderStageInfo.pNext._0_4_ = 0;
  pipelineShaderStageInfo.flags = (undefined4)local_48.m_internal;
  pipelineShaderStageInfo.stage = local_48.m_internal._4_4_;
  pipelineShaderStageInfo.module.m_internal = (long)"pre_main" + 4;
  pipelineShaderStageInfo.pName = (char *)module.m_internal;
  this->m_shaderStageFlags = stage | this->m_shaderStageFlags;
  pipelineShaderStageInfo.pNext._4_4_ = stage;
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::push_back(&this->m_shaderStages,(value_type *)local_1c8);
  return this;
}

Assistant:

GraphicsPipelineBuilder& GraphicsPipelineBuilder::setShader (const DeviceInterface&			vk,
															 const VkDevice					device,
															 const VkShaderStageFlagBits	stage,
															 const ProgramBinary&			binary,
															 const VkSpecializationInfo*	specInfo)
{
	VkShaderModule module;
	switch (stage)
	{
		case (VK_SHADER_STAGE_VERTEX_BIT):
			DE_ASSERT(m_vertexShaderModule.get() == DE_NULL);
			m_vertexShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_vertexShaderModule;
			break;

		case (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT):
			DE_ASSERT(m_tessControlShaderModule.get() == DE_NULL);
			m_tessControlShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_tessControlShaderModule;
			break;

		case (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT):
			DE_ASSERT(m_tessEvaluationShaderModule.get() == DE_NULL);
			m_tessEvaluationShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_tessEvaluationShaderModule;
			break;

		case (VK_SHADER_STAGE_GEOMETRY_BIT):
			DE_ASSERT(m_geometryShaderModule.get() == DE_NULL);
			m_geometryShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_geometryShaderModule;
			break;

		case (VK_SHADER_STAGE_FRAGMENT_BIT):
			DE_ASSERT(m_fragmentShaderModule.get() == DE_NULL);
			m_fragmentShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_fragmentShaderModule;
			break;

		default:
			DE_FATAL("Invalid shader stage");
			return *this;
	}

	const VkPipelineShaderStageCreateInfo pipelineShaderStageInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
		stage,													// VkShaderStageFlagBits				stage;
		module,													// VkShaderModule						module;
		"main",													// const char*							pName;
		specInfo,												// const VkSpecializationInfo*			pSpecializationInfo;
	};

	m_shaderStageFlags |= stage;
	m_shaderStages.push_back(pipelineShaderStageInfo);

	return *this;
}